

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

void __thiscall llvm::APFloat::changeSign(APFloat *this)

{
  bool bVar1;
  fltSemantics *pfVar2;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    detail::IEEEFloat::changeSign(&(this->U).IEEE);
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x41a);
    }
    detail::DoubleAPFloat::changeSign((DoubleAPFloat *)&(this->U).IEEE);
  }
  return;
}

Assistant:

void changeSign() { APFLOAT_DISPATCH_ON_SEMANTICS(changeSign()); }